

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

int ppcemb_tlb_search(CPUPPCState_conflict2 *env,target_ulong address,uint32_t pid)

{
  uint32_t *puVar1;
  long lVar2;
  
  if (0 < (long)env->nb_tlb) {
    puVar1 = &((env->tlb).tlbe)->prot;
    lVar2 = 0;
    do {
      if ((((*puVar1 & 8) != 0) &&
          (*(ulong *)(puVar1 + -4) == 0 || *(ulong *)(puVar1 + -4) == (ulong)pid)) &&
         ((-*(target_ulong *)(puVar1 + -2) & address) == *(target_ulong *)(puVar1 + -6))) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
      puVar1 = puVar1 + 10;
    } while (env->nb_tlb != lVar2);
  }
  return -1;
}

Assistant:

static int ppcemb_tlb_search(CPUPPCState *env, target_ulong address,
                             uint32_t pid)
{
    ppcemb_tlb_t *tlb;
    hwaddr raddr;
    int i, ret;

    /* Default return value is no match */
    ret = -1;
    for (i = 0; i < env->nb_tlb; i++) {
        tlb = &env->tlb.tlbe[i];
        if (ppcemb_tlb_check(env, tlb, &raddr, address, pid, 0, i) == 0) {
            ret = i;
            break;
        }
    }

    return ret;
}